

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SamplePosDistributionCase::verifySampleBuffers
          (SamplePosDistributionCase *this,
          vector<tcu::Surface,_std::allocator<tcu::Surface>_> *resultBuffers)

{
  float *pfVar1;
  ostringstream *poVar2;
  byte bVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  undefined8 uVar7;
  TestLog *pTVar8;
  ulong uVar9;
  QualityWarning *this_00;
  int iVar10;
  LogImage *__return_storage_ptr__;
  ulong uVar11;
  size_t sVar12;
  ConstPixelBufferAccess *pCVar13;
  undefined **__n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  ulong uVar14;
  void *__buf_03;
  void *__buf_04;
  uint uVar15;
  long lVar16;
  vector<tcu::Surface,_std::allocator<tcu::Surface>_> *pvVar17;
  int iVar18;
  pointer pSVar19;
  pointer pSVar20;
  int sampleNdx_1;
  uint uVar21;
  size_t in_R9;
  int iVar22;
  vector<tcu::Surface,_std::allocator<tcu::Surface>_> *pvVar23;
  int iVar24;
  int sampleNdx;
  long lVar25;
  float fVar26;
  size_t sStack_3a0;
  allocator<char> local_388;
  allocator<char> local_387;
  allocator<char> local_386;
  allocator<char> local_385;
  uint local_384;
  vector<tcu::Surface,_std::allocator<tcu::Surface>_> *local_380;
  uint local_378;
  uint local_374;
  int local_370;
  uint local_36c;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> samplePositions;
  Surface errorMask;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318;
  string local_2f8;
  long local_2d8;
  string local_2d0;
  LogImageSet local_2b0;
  ConstPixelBufferAccess local_270;
  MessageBuilder local_248;
  LogImage local_c8;
  
  pSVar19 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl
            .super__Vector_impl_data._M_start;
  local_374 = pSVar19->m_width;
  sVar12 = (size_t)local_374;
  local_378 = pSVar19->m_height;
  pTVar8 = ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
            super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"SampleBuffers",(allocator<char> *)&local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"Image sample buffers",(allocator<char> *)&local_338);
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_248,&local_c8.m_name,&local_2b0.m_name);
  local_380 = resultBuffers;
  tcu::LogImageSet::write((LogImageSet *)&local_248,(int)pTVar8,__buf,sVar12);
  tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_248);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_c8);
  sStack_3a0 = in_R9;
  for (local_318._M_dataplus._M_p._0_4_ = 0;
      (int)local_318._M_dataplus._M_p <
      (int)(((long)(local_380->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(local_380->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                  _M_impl.super__Vector_impl_data._M_start) / 0x18);
      local_318._M_dataplus._M_p._0_4_ = (int)local_318._M_dataplus._M_p + 1) {
    pTVar8 = ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
              super_TestCase.super_TestNode.m_testCtx)->m_log;
    de::toString<int>((string *)&local_270,(int *)&local_318);
    std::operator+(&local_2b0.m_name,"Buffer",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270);
    de::toString<int>(&local_2f8,(int *)&local_318);
    std::operator+(&local_338,"Sample ",&local_2f8);
    __return_storage_ptr__ = &local_c8;
    tcu::Surface::getAccess
              ((ConstPixelBufferAccess *)__return_storage_ptr__,
               (local_380->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
               super__Vector_impl_data._M_start + (int)local_318._M_dataplus._M_p);
    tcu::LogImage::LogImage
              ((LogImage *)&local_248,&local_2b0.m_name,&local_338,
               (ConstPixelBufferAccess *)__return_storage_ptr__,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&local_248,(int)pTVar8,__buf_00,(size_t)__return_storage_ptr__)
    ;
    tcu::LogImage::~LogImage((LogImage *)&local_248);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_270);
  }
  tcu::TestLog::endImageSet
            (((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
              super_TestCase.super_TestNode.m_testCtx)->m_log);
  local_248.m_log =
       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
        super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = &local_248.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  std::operator<<((ostream *)poVar2,"Verifying sample position range");
  tcu::MessageBuilder::operator<<(&local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
  uVar7 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  local_384 = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
  poVar2 = &local_248.m_str;
  lVar16 = 0;
  pvVar23 = local_380;
  for (lVar25 = 0; pvVar17 = local_380,
      lVar25 < (int)(((long)(pvVar23->
                            super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(pvVar23->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x18); lVar25 = lVar25 + 1)
  {
    local_248.m_log =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    std::operator<<((ostream *)poVar2,"Verifying sample ");
    std::ostream::operator<<(poVar2,(int)lVar25 + 1);
    std::operator<<((ostream *)poVar2,"/");
    std::ostream::operator<<
              (poVar2,(int)(((long)(local_380->
                                   super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_380->
                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                  _M_impl.super__Vector_impl_data._M_start) / 0x18));
    tcu::MessageBuilder::operator<<(&local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
    pvVar23 = local_380;
    local_248.m_log = (TestLog *)&PTR_verify_00a0be00;
    bVar5 = verifyImageWithVerifier
                      ((Surface *)
                       ((long)&((local_380->
                                super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                _M_impl.super__Vector_impl_data._M_start)->m_width + lVar16),
                       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log,
                       (Verifier *)&local_248,false);
    local_384 = CONCAT31((int3)(local_384 >> 8),(byte)local_384 & bVar5);
    lVar16 = lVar16 + 0x18;
  }
  if ((char)local_384 == '\0') {
    local_248.m_log =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = &local_248.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    std::operator<<((ostream *)poVar2,"Sample position verification failed.");
    tcu::MessageBuilder::operator<<(&local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  }
  tcu::Surface::Surface(&errorMask,local_374,local_378);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&samplePositions,
             ((long)(pvVar17->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar17->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&local_248);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_248,&errorMask);
  local_c8.m_name._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_c8.m_name._M_string_length = 0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)&local_248,(Vec4 *)&local_c8);
  local_248.m_log =
       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
        super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = &local_248.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  std::operator<<((ostream *)poVar2,"Verifying sample position uniqueness.");
  tcu::MessageBuilder::operator<<(&local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  poVar2 = &local_248.m_str;
  iVar22 = 0;
  local_36c = 0;
  if (0 < (int)local_374) {
    local_36c = local_374;
  }
  uVar11 = 0;
  if (0 < (int)local_378) {
    uVar11 = (ulong)local_378;
  }
  local_370 = (int)uVar11;
  sVar12 = CONCAT71((int7)(uVar11 >> 8),1);
  iVar24 = 0;
  for (; iVar22 != local_370; iVar22 = iVar22 + 1) {
    for (uVar15 = 0; uVar15 != local_36c; uVar15 = uVar15 + 1) {
      lVar16 = 1;
      lVar25 = 0;
      while( true ) {
        pSVar19 = (pvVar17->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        pSVar20 = (pvVar17->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl
                  .super__Vector_impl_data._M_finish;
        if ((int)(((long)pSVar20 - (long)pSVar19) / 0x18) <= lVar25) break;
        uVar21 = *(uint *)(*(long *)(&pSVar19->m_width + lVar16 * 2) +
                          (long)(int)(*(int *)((long)pSVar19 + lVar16 * 8 + -8) * iVar22 + uVar15) *
                          4);
        *(float *)(CONCAT44(samplePositions.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)samplePositions.
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) + lVar25 * 8) =
             (float)(uVar21 >> 8 & 0xff) / 255.0;
        *(float *)(CONCAT44(samplePositions.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)samplePositions.
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) + 4 + lVar25 * 8) =
             (float)(uVar21 >> 0x10 & 0xff) / 255.0;
        lVar25 = lVar25 + 1;
        lVar16 = lVar16 + 3;
      }
      lVar25 = 0;
      lVar16 = 1;
      bVar3 = 0;
      while( true ) {
        sStack_3a0 = 0x18;
        if (((int)(((long)pSVar20 - (long)pSVar19) / 0x18) <= lVar25) ||
           (lVar4 = lVar16, (bool)(4 < iVar24 & bVar3))) break;
        while ((local_2d8 = lVar4, lVar16 < (int)(((long)pSVar20 - (long)pSVar19) / 0x18) &&
               (!(bool)(4 < iVar24 & bVar3)))) {
          lVar4 = CONCAT44(samplePositions.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (int)samplePositions.
                                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          fVar26 = *(float *)(lVar4 + lVar25 * 8);
          pfVar1 = (float *)(lVar4 + lVar16 * 8);
          if ((fVar26 == *pfVar1) && (!NAN(fVar26) && !NAN(*pfVar1))) {
            fVar26 = *(float *)(lVar4 + 4 + lVar25 * 8);
            pfVar1 = (float *)(lVar4 + 4 + lVar16 * 8);
            if ((fVar26 == *pfVar1) && (!NAN(fVar26) && !NAN(*pfVar1))) {
              iVar24 = iVar24 + 1;
              if (iVar24 < 6) {
                local_248.m_log =
                     ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase
                      .super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
                std::operator<<((ostream *)poVar2,"Pixel (");
                std::ostream::operator<<(poVar2,uVar15);
                std::operator<<((ostream *)poVar2,", ");
                std::ostream::operator<<(poVar2,iVar22);
                std::operator<<((ostream *)poVar2,"): Samples ");
                std::ostream::operator<<(poVar2,(int)lVar25);
                std::operator<<((ostream *)poVar2," and ");
                std::ostream::operator<<(poVar2,(int)lVar16);
                std::operator<<((ostream *)poVar2," have the same position.");
                tcu::MessageBuilder::operator<<
                          (&local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
                pSVar19 = (local_380->
                          super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                pSVar20 = (local_380->
                          super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
              }
              *(undefined4 *)
               (CONCAT44(errorMask.m_pixels.m_ptr._4_4_,(int)errorMask.m_pixels.m_ptr) +
               (long)(int)(errorMask.m_width * iVar22 + uVar15) * 4) = 0xff0000ff;
              bVar3 = 1;
              sVar12 = 0;
            }
          }
          lVar16 = lVar16 + 1;
          lVar4 = local_2d8;
        }
        lVar25 = lVar25 + 1;
        lVar16 = local_2d8 + 1;
      }
      pvVar17 = local_380;
    }
  }
  if ((sVar12 & 1) == 0) {
    if (5 < iVar24) {
      local_248.m_log =
           ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
            super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = &local_248.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      std::operator<<((ostream *)poVar2,"...\n");
      std::operator<<((ostream *)poVar2,"Omitted ");
      std::ostream::operator<<(poVar2,iVar24 + -5);
      std::operator<<((ostream *)poVar2," error descriptions.");
      tcu::MessageBuilder::operator<<(&local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
    }
    local_248.m_log =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = &local_248.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    std::operator<<((ostream *)poVar2,"Image verification failed.");
    pTVar8 = tcu::MessageBuilder::operator<<
                       (&local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"Verification",&local_385);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"Image Verification",&local_386);
    tcu::LogImageSet::LogImageSet(&local_2b0,&local_338,&local_2f8);
    tcu::LogImageSet::write(&local_2b0,(int)pTVar8,__buf_01,sVar12);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"ErrorMask",&local_387);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"Error Mask",&local_388)
    ;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_270,&errorMask);
    pCVar13 = &local_270;
    tcu::LogImage::LogImage(&local_c8,&local_318,&local_2d0,pCVar13,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_c8,(int)pTVar8,__buf_02,(size_t)pCVar13);
    tcu::TestLog::endImageSet(pTVar8);
    tcu::LogImage::~LogImage(&local_c8);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_318);
    tcu::LogImageSet::~LogImageSet(&local_2b0);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
    local_384 = 0;
  }
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&samplePositions.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  tcu::Surface::~Surface(&errorMask);
  errorMask.m_pixels.m_ptr._0_4_ =
       (this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_numTargetSamples;
  __n = &PTR_verify_00a0c138;
  errorMask._0_8_ = &PTR_verify_00a0c138;
  errorMask.m_pixels.m_ptr._4_1_ = 3 < (int)errorMask.m_pixels.m_ptr;
  fVar26 = 1.0 / ((float)(int)errorMask.m_pixels.m_ptr * 12.0);
  if (fVar26 < 0.0) {
    fVar26 = sqrtf(fVar26);
  }
  else {
    fVar26 = SQRT(fVar26);
  }
  errorMask.m_pixels.m_cap._0_4_ = fVar26 + fVar26;
  tcu::Surface::Surface((Surface *)&samplePositions,local_374,local_378);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_248,(Surface *)&samplePositions);
  local_c8.m_name._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_c8.m_name._M_string_length = 0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)&local_248,(Vec4 *)&local_c8);
  if (errorMask.m_pixels.m_ptr._4_1_ == '\x01') {
    local_248.m_log =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = &local_248.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    std::operator<<((ostream *)poVar2,"Verifying sample position distribution is (nearly) unbiased."
                   );
    tcu::MessageBuilder::operator<<(&local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
    SampleAverageVerifier::logInfo
              ((SampleAverageVerifier *)&errorMask,
               ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
                super_TestCase.super_TestNode.m_testCtx)->m_log);
    poVar2 = &local_248.m_str;
    bVar5 = false;
    iVar22 = 0;
    for (iVar24 = 0; iVar24 != local_370; iVar24 = iVar24 + 1) {
      for (uVar15 = 0; uVar15 != local_36c; uVar15 = uVar15 + 1) {
        pSVar19 = (local_380->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar9 = ((long)(local_380->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pSVar19) / 0x18;
        uVar14 = 0;
        uVar11 = uVar9 & 0xffffffff;
        if ((int)uVar9 < 1) {
          uVar11 = uVar14;
        }
        iVar6 = 0;
        iVar18 = 0;
        __n = (undefined **)0x0;
        for (; iVar10 = (int)__n, uVar11 * 0x18 - uVar14 != 0; uVar14 = uVar14 + 0x18) {
          uVar21 = *(uint *)(*(long *)((long)&(pSVar19->m_pixels).m_ptr + uVar14) +
                            (long)(int)(*(int *)((long)&pSVar19->m_width + uVar14) * iVar24 + uVar15
                                       ) * 4);
          iVar6 = iVar6 + (uVar21 & 0xff);
          iVar18 = iVar18 + (uVar21 >> 0x10 & 0xff);
          uVar21 = uVar21 >> 8 & 0xff;
          sStack_3a0 = (size_t)uVar21;
          __n = (undefined **)(ulong)(iVar10 + uVar21);
        }
        uVar21 = (this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_numTargetSamples;
        local_248.m_log =
             (TestLog *)
             CONCAT44(local_248.m_log._4_4_,
                      iVar18 / (int)uVar21 << 8 | iVar6 / (int)uVar21 | iVar10 / (int)uVar21 << 0x10
                     );
        iVar6 = SampleAverageVerifier::verify
                          ((SampleAverageVerifier *)&errorMask,(EVP_PKEY_CTX *)&local_248,
                           (uchar *)((long)iVar10 % (long)(int)uVar21 & 0xffffffff),(size_t)__n,
                           (uchar *)(ulong)uVar21,sStack_3a0);
        if ((char)iVar6 == '\0') {
          iVar22 = iVar22 + 1;
          if (iVar22 < 6) {
            local_248.m_log =
                 ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
                  super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
            std::operator<<((ostream *)poVar2,"Pixel (");
            std::ostream::operator<<(poVar2,uVar15);
            std::operator<<((ostream *)poVar2,", ");
            std::ostream::operator<<(poVar2,iVar24);
            std::operator<<((ostream *)poVar2,"): Sample distribution is biased.");
            tcu::MessageBuilder::operator<<(&local_248,(EndMessageToken *)&tcu::TestLog::EndMessage)
            ;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
          }
          (samplePositions.
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->m_data
          [(int)((int)samplePositions.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start * iVar24 + uVar15)] = -1.7014636e+38
          ;
          bVar5 = true;
          __n = (undefined **)
                samplePositions.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
        }
      }
    }
    if (bVar5) {
      if (5 < iVar22) {
        local_248.m_log =
             ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
              super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = &local_248.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        std::operator<<((ostream *)poVar2,"...\n");
        std::operator<<((ostream *)poVar2,"Omitted ");
        std::ostream::operator<<(poVar2,iVar22 + -5);
        std::operator<<((ostream *)poVar2," error descriptions.");
        tcu::MessageBuilder::operator<<(&local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
      }
      local_248.m_log =
           ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
            super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = &local_248.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      std::operator<<((ostream *)poVar2,"Image verification failed.");
      pTVar8 = tcu::MessageBuilder::operator<<
                         (&local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_338,"Verification",&local_385);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,"Image Verification",&local_386);
      tcu::LogImageSet::LogImageSet(&local_2b0,&local_338,&local_2f8);
      tcu::LogImageSet::write(&local_2b0,(int)pTVar8,__buf_03,(size_t)__n);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_318,"ErrorMask",&local_387);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d0,"Error Mask",&local_388);
      tcu::Surface::getAccess((PixelBufferAccess *)&local_270,(Surface *)&samplePositions);
      pCVar13 = &local_270;
      tcu::LogImage::LogImage
                (&local_c8,&local_318,&local_2d0,pCVar13,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_c8,(int)pTVar8,__buf_04,(size_t)pCVar13);
      tcu::TestLog::endImageSet(pTVar8);
      tcu::LogImage::~LogImage(&local_c8);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_318);
      tcu::LogImageSet::~LogImageSet(&local_2b0);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
    }
  }
  else {
    bVar5 = false;
  }
  tcu::Surface::~Surface((Surface *)&samplePositions);
  if ((local_384 & 1) != 0) {
    if (bVar5) {
      this_00 = (QualityWarning *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,
                 "Bias detected, sample positions are not uniformly distributed within the pixel",
                 (allocator<char> *)&local_c8);
      MultisampleShaderRenderUtil::QualityWarning::QualityWarning(this_00,(string *)&local_248);
      __cxa_throw(this_00,&MultisampleShaderRenderUtil::QualityWarning::typeinfo,
                  tcu::Exception::~Exception);
    }
    local_248.m_log =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = &local_248.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    std::operator<<((ostream *)poVar2,"Verification ok.");
    tcu::MessageBuilder::operator<<(&local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  }
  return (bool)((byte)local_384 & 1);
}

Assistant:

bool SamplePosDistributionCase::verifySampleBuffers (const std::vector<tcu::Surface>& resultBuffers)
{
	const int	width				= resultBuffers[0].getWidth();
	const int	height				= resultBuffers[0].getHeight();
	bool		allOk				= true;
	bool		distibutionError	= false;

	// Check sample range, uniqueness, and distribution, log layers
	{
		m_testCtx.getLog() << tcu::TestLog::ImageSet("SampleBuffers", "Image sample buffers");
		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			m_testCtx.getLog() << tcu::TestLog::Image("Buffer" + de::toString(sampleNdx), "Sample " + de::toString(sampleNdx), resultBuffers[sampleNdx].getAccess());
		m_testCtx.getLog() << tcu::TestLog::EndImageSet;
	}

	// verify range
	{
		bool rangeOk = true;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample position range" << tcu::TestLog::EndMessage;
		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
		{
			// shader does the check, just check the shader error output (red)
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample " << (sampleNdx+1) << "/" << (int)resultBuffers.size() << tcu::TestLog::EndMessage;
			rangeOk &= verifyImageWithVerifier(resultBuffers[sampleNdx], m_testCtx.getLog(), NoRedVerifier(), false);
		}

		if (!rangeOk)
		{
			allOk = false;

			m_testCtx.getLog() << tcu::TestLog::Message << "Sample position verification failed." << tcu::TestLog::EndMessage;
		}
	}

	// Verify uniqueness
	{
		bool					uniquenessOk	= true;
		tcu::Surface			errorMask		(width, height);
		std::vector<tcu::Vec2>	samplePositions	(resultBuffers.size());
		int						printCount		= 0;
		const int				printFloodLimit	= 5;

		tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample position uniqueness." << tcu::TestLog::EndMessage;

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			bool samplePosNotUnique = false;

			for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			{
				const tcu::RGBA color = resultBuffers[sampleNdx].getPixel(x, y);
				samplePositions[sampleNdx] = tcu::Vec2((float)color.getGreen() / 255.0f, (float)color.getBlue() / 255.0f);
			}

			// Just check there are no two samples with same positions
			for (int sampleNdxA = 0;            sampleNdxA < (int)resultBuffers.size() && (!samplePosNotUnique || printCount < printFloodLimit); ++sampleNdxA)
			for (int sampleNdxB = sampleNdxA+1; sampleNdxB < (int)resultBuffers.size() && (!samplePosNotUnique || printCount < printFloodLimit); ++sampleNdxB)
			{
				if (samplePositions[sampleNdxA] == samplePositions[sampleNdxB])
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Samples " << sampleNdxA << " and " << sampleNdxB << " have the same position."
							<< tcu::TestLog::EndMessage;
					}

					samplePosNotUnique = true;
					uniquenessOk = false;
					errorMask.setPixel(x, y, tcu::RGBA::red());
				}
			}
		}

		// end result
		if (!uniquenessOk)
		{
			if (printCount > printFloodLimit)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "...\n"
					<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
					<< tcu::TestLog::EndMessage;

			m_testCtx.getLog()
				<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
				<< tcu::TestLog::ImageSet("Verification", "Image Verification")
				<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
				<< tcu::TestLog::EndImageSet;

			allOk = false;
		}
	}

	// check distribution
	{
		const SampleAverageVerifier verifier		(m_numTargetSamples);
		tcu::Surface				errorMask		(width, height);
		int							printCount		= 0;
		const int					printFloodLimit	= 5;

		tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		// don't bother with small sample counts
		if (verifier.m_isStatisticallySignificant)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample position distribution is (nearly) unbiased." << tcu::TestLog::EndMessage;
			verifier.logInfo(m_testCtx.getLog());

			for (int y = 0; y < height; ++y)
			for (int x = 0; x < width; ++x)
			{
				tcu::IVec3 colorSum(0, 0, 0);

				// color average

				for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
				{
					const tcu::RGBA color = resultBuffers[sampleNdx].getPixel(x, y);
					colorSum.x() += color.getRed();
					colorSum.y() += color.getBlue();
					colorSum.z() += color.getGreen();
				}

				colorSum.x() /= m_numTargetSamples;
				colorSum.y() /= m_numTargetSamples;
				colorSum.z() /= m_numTargetSamples;

				// verify average sample position

				if (!verifier.verify(tcu::RGBA(colorSum.x(), colorSum.y(), colorSum.z(), 0), tcu::IVec2(x, y)))
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Sample distribution is biased."
							<< tcu::TestLog::EndMessage;
					}

					distibutionError = true;
					errorMask.setPixel(x, y, tcu::RGBA::red());
				}
			}

			// sub-verification result
			if (distibutionError)
			{
				if (printCount > printFloodLimit)
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "...\n"
						<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
						<< tcu::TestLog::EndMessage;

				m_testCtx.getLog()
					<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
					<< tcu::TestLog::ImageSet("Verification", "Image Verification")
					<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
					<< tcu::TestLog::EndImageSet;
			}
		}
	}

	// results
	if (!allOk)
		return false;
	else if (distibutionError)
		throw MultisampleShaderRenderUtil::QualityWarning("Bias detected, sample positions are not uniformly distributed within the pixel");
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verification ok." << tcu::TestLog::EndMessage;
		return true;
	}
}